

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t derTBITDec2(octet *val,octet *der,size_t count,u32 tag,size_t len)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  u32 t;
  size_t l;
  u32 local_34;
  size_t local_30;
  
  sVar2 = derTLDec(&local_34,&local_30,der,count);
  sVar3 = 0xffffffffffffffff;
  if (sVar2 == 0xffffffffffffffff) {
    sVar4 = 0xffffffffffffffff;
  }
  else {
    der = der + sVar2;
    sVar4 = 0xffffffffffffffff;
    if (local_30 + sVar2 <= count) {
      sVar4 = local_30 + sVar2;
    }
  }
  if ((local_34 == tag && sVar4 != 0xffffffffffffffff) && (local_30 != 0)) {
    bVar1 = *der;
    if ((((ulong)bVar1 < 8) &&
        (((local_30 != 1 || (bVar1 == 0)) && (local_30 * 8 + -8 == bVar1 + len)))) &&
       (sVar3 = sVar4, val != (octet *)0x0)) {
      memMove(val,der + 1,local_30 - 1);
    }
  }
  return sVar3;
}

Assistant:

size_t derTBITDec2(octet* val, const octet der[], size_t count, u32 tag,
	size_t len)
{
	const octet* v;
	size_t l;
	// декодировать
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// в значении менее одного октета?
	// число битов дополнения больше 7?
	// биты дополнения в несуществующем октете?
	// длина не соответствует ожидаемой?
	if (l < 1 || v[0] > 7 || v[0] != 0 && l == 1 || (l - 1) * 8 != len + v[0])
		return SIZE_MAX;
	// возвратить строку
	if (val)
		memMove(val, v + 1, l - 1);
	return count;
}